

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_c8515::ScaleBPM_ignored_interaction_Test::TestBody
          (ScaleBPM_ignored_interaction_Test *this)

{
  void *pvVar1;
  char *pcVar2;
  long lVar3;
  double dVar4;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  AssertionResult gtest_ar;
  Polynomial<uint32_t,_double> polynomial;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  AssertHelper local_220;
  undefined4 local_218;
  undefined1 local_210 [8];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined8 uStack_200;
  allocator_type local_1f4;
  allocator_type local_1f3;
  allocator_type local_1f2;
  allocator_type local_1f1;
  pointer local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  uint local_1a0 [2];
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_198;
  BinaryPolynomialModel<unsigned_int,_double> local_160;
  
  GeneratePolynomialUINT();
  for (; local_198._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      local_198._M_before_begin._M_nxt = (local_198._M_before_begin._M_nxt)->_M_nxt) {
    local_198._M_before_begin._M_nxt[4]._M_nxt =
         (_Hash_node_base *)
         ((double)local_198._M_before_begin._M_nxt[4]._M_nxt +
         (double)local_198._M_before_begin._M_nxt[4]._M_nxt);
  }
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel
            (&local_160,(Polynomial<unsigned_int,_double> *)&local_198,SPIN);
  local_1f0 = (pointer)&DAT_200000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_1f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1e8,__l,&local_1f1);
  local_1a0[0] = 2;
  local_1a0[1] = 4;
  __l_00._M_len = 2;
  __l_00._M_array = local_1a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1d0,__l_00,&local_1f2);
  local_220.data_ = (AssertHelperData *)0x300000001;
  local_218 = 4;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_220;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1b8,__l_01,&local_1f3);
  __l_02._M_len = 3;
  __l_02._M_array = &local_1e8;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_210,__l_02,&local_1f4);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::Scale
            (&local_160,0.5,(PolynomialKeyList<unsigned_int> *)local_210,false);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)&uStack_200 + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_1f0 + lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  local_220.data_ = (AssertHelperData *)&DAT_200000001;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_220;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e8,__l_03,(allocator_type *)&local_1f0);
  dVar4 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial(&local_160,&local_1e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_210,"bpm.GetPolynomial({1, 2} )","12.0*2",dVar4,24.0);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1e8);
    if ((undefined8 *)CONCAT44(uStack_204,local_208) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(uStack_204,local_208);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x49d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_204,local_208) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_204,local_208));
  }
  local_220.data_ = (AssertHelperData *)0x400000002;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_220;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e8,__l_04,(allocator_type *)&local_1f0);
  dVar4 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial(&local_160,&local_1e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_210,"bpm.GetPolynomial({2, 4} )","24.0*2",dVar4,48.0);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1e8);
    if ((undefined8 *)CONCAT44(uStack_204,local_208) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(uStack_204,local_208);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x49e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_204,local_208) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_204,local_208));
  }
  local_220.data_ = (AssertHelperData *)0x300000001;
  local_218 = 4;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&local_220;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e8,__l_05,(allocator_type *)&local_1f0);
  dVar4 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial(&local_160,&local_1e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_210,"bpm.GetPolynomial({1, 3, 4})","134.0*2",dVar4,268.0);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1e8);
    if ((undefined8 *)CONCAT44(uStack_204,local_208) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(uStack_204,local_208);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x49f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_204,local_208) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_204,local_208));
  }
  local_210 = (undefined1  [8])&DAT_200000001;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_210;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e8,__l_06,(allocator_type *)&local_1f0);
  local_220.data_ = (AssertHelperData *)0xc028000000000000;
  cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteraction
            (&local_160,&local_1e8,(double *)&local_220,NONE);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_210 = (undefined1  [8])0x400000002;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_210;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e8,__l_07,(allocator_type *)&local_1f0);
  local_220.data_ = (AssertHelperData *)0xc038000000000000;
  cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteraction
            (&local_160,&local_1e8,(double *)&local_220,NONE);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_210 = (undefined1  [8])0x300000001;
  local_208 = 4;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)local_210;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e8,__l_08,(allocator_type *)&local_1f0);
  local_220.data_ = (AssertHelperData *)0xc060c00000000000;
  cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteraction
            (&local_160,&local_1e8,(double *)&local_220,NONE);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  StateTestBPMUINT(&local_160);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_160.poly_key_inv_._M_h);
  if (local_160.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_160.poly_key_list_);
  if (local_160.sorted_variables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.sorted_variables_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.sorted_variables_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.sorted_variables_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_160.variables_to_integers_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_160.each_variable_num_._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_160);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_198);
  return;
}

Assistant:

TEST(ScaleBPM, ignored_interaction) {
   
   Polynomial<uint32_t, double> polynomial = GeneratePolynomialUINT();
   
   for (auto &&it: polynomial) {
      it.second *= 2;
   }
      
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   bpm.Scale(0.5, {{1,2}, {2, 4}, {1, 3, 4}});
   
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 2}   ), 12.0*2 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2, 4}   ), 24.0*2 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 3, 4}), 134.0*2);

   bpm.AddInteraction({1, 2}   , -12.0);
   bpm.AddInteraction({2, 4}   , -24.0);
   bpm.AddInteraction({1, 3, 4}, -134.0);
   
   StateTestBPMUINT(bpm);

}